

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IRenderPass> __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderPass>::Lock(RefCntWeakPtr<Diligent::IRenderPass> *this)

{
  RefCountersImpl *this_00;
  bool bVar1;
  IObject **ppObject;
  RefCntWeakPtr<Diligent::IRenderPass> *in_RSI;
  DoublePtrHelper<Diligent::IObject> local_38;
  RefCntAutoPtr<Diligent::IObject> local_28;
  RefCntAutoPtr<Diligent::IObject> spOwner;
  RefCntWeakPtr<Diligent::IRenderPass> *this_local;
  RefCntAutoPtr<Diligent::IRenderPass> *spObj;
  
  spOwner.m_pObject._7_1_ = 0;
  RefCntAutoPtr<Diligent::IRenderPass>::RefCntAutoPtr((RefCntAutoPtr<Diligent::IRenderPass> *)this);
  if (in_RSI->m_pRefCounters != (RefCountersImpl *)0x0) {
    RefCntAutoPtr<Diligent::IObject>::RefCntAutoPtr(&local_28);
    this_00 = in_RSI->m_pRefCounters;
    RefCntAutoPtr<Diligent::IObject>::operator&((RefCntAutoPtr<Diligent::IObject> *)&local_38);
    ppObject = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IObject__
                         ((DoublePtrHelper *)&local_38);
    RefCountersImpl::QueryObject(this_00,ppObject);
    RefCntAutoPtr<Diligent::IObject>::DoublePtrHelper<Diligent::IObject>::~DoublePtrHelper
              (&local_38);
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&local_28);
    if (bVar1) {
      RefCntAutoPtr<Diligent::IRenderPass>::operator=
                ((RefCntAutoPtr<Diligent::IRenderPass> *)this,in_RSI->m_pObject);
    }
    else {
      Release(in_RSI);
    }
    RefCntAutoPtr<Diligent::IObject>::~RefCntAutoPtr(&local_28);
  }
  return (RefCntAutoPtr<Diligent::IRenderPass>)(IRenderPass *)this;
}

Assistant:

RefCntAutoPtr<T> Lock()
    {
        RefCntAutoPtr<T> spObj;
        if (m_pRefCounters)
        {
            // Try to obtain a pointer to the owner object.
            // spOwner is only used to keep the object
            // alive while obtaining strong reference from
            // the raw pointer m_pObject
            RefCntAutoPtr<IObject> spOwner;
            m_pRefCounters->QueryObject(&spOwner);
            if (spOwner)
            {
                // If owner is alive, we can use our RAW pointer to
                // create strong reference
                spObj = m_pObject;
            }
            else
            {
                // Owner object has been destroyed. There is no reason
                // to keep this weak reference anymore
                Release();
            }
        }
        return spObj;
    }